

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  char cVar1;
  iterator data;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  iterator in_start;
  iterator in_end;
  StringRef SVar5;
  char local_99;
  AlignedCharArrayUnion<char> local_98 [16];
  size_t local_88;
  size_t pos;
  undefined1 local_70 [8];
  StringRef ext;
  SmallString<32U> ext_storage;
  StringRef p;
  Style style_local;
  Twine *extension_local;
  SmallVectorImpl<char> *path_local;
  
  data = SmallVectorTemplateCommon<char,_void>::begin((SmallVectorTemplateCommon<char,_void> *)path)
  ;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)path);
  StringRef::StringRef
            ((StringRef *)
             (ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
              InlineElts + 0x18),data,sVar2);
  SmallString<32U>::SmallString((SmallString<32U> *)&ext.Length);
  SVar5 = Twine::toStringRef(extension,(SmallVectorImpl<char> *)&ext.Length);
  ext.Data = (char *)SVar5.Length;
  pcVar3 = SVar5.Data;
  local_70 = (undefined1  [8])pcVar3;
  sVar2 = StringRef::find_last_of
                    ((StringRef *)
                     (ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                      InlineElts + 0x18),'.',0xffffffffffffffff);
  local_88 = sVar2;
  if (sVar2 != 0xffffffffffffffff) {
    local_98[0].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x18].buffer[0];
    local_98[1].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x19].buffer[0];
    local_98[2].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1a].buffer[0];
    local_98[3].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1b].buffer[0];
    local_98[4].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1c].buffer[0];
    local_98[5].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1d].buffer[0];
    local_98[6].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1e].buffer[0];
    local_98[7].buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1f].buffer[0];
    SVar5.Length._0_4_ = style;
    SVar5.Data = p.Data;
    SVar5.Length._4_4_ = 0;
    sVar4 = anon_unknown.dwarf_2a5bf16::filename_pos
                      ((anon_unknown_dwarf_2a5bf16 *)
                       ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                       InlineElts._24_8_,SVar5,(Style)pcVar3);
    if (sVar4 <= sVar2) {
      SmallVectorBase::set_size((SmallVectorBase *)path,local_88);
    }
  }
  sVar2 = StringRef::size((StringRef *)local_70);
  if (sVar2 != 0) {
    cVar1 = StringRef::operator[]((StringRef *)local_70,0);
    if (cVar1 != '.') {
      local_99 = '.';
      SmallVectorTemplateBase<char,_true>::push_back
                (&path->super_SmallVectorTemplateBase<char,_true>,&local_99);
    }
  }
  in_start = StringRef::begin((StringRef *)local_70);
  in_end = StringRef::end((StringRef *)local_70);
  SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_end);
  SmallString<32U>::~SmallString((SmallString<32U> *)&ext.Length);
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}